

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderBatched
          (DrawCallBatchingTest *this)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  GLint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  deUint64 dVar9;
  int attribute;
  long lVar10;
  int attribNdx;
  long lVar11;
  int local_a0;
  GLint location;
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  deUint64 local_60;
  deUint64 local_58;
  string local_50;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar7 + 0x1a00))(0,0,0x20);
  (**(code **)(lVar7 + 0x1680))((this->m_program->m_program).m_program);
  for (local_a0 = 0; local_a0 < (this->m_spec).staticAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_static",&local_50);
    uVar4 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(lVar7 + 0x610))(uVar4);
    if ((this->m_spec).useStaticBuffer == true) {
      (**(code **)(lVar7 + 0x40))
                (0x8892,(this->m_batchedStaticBuffers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_a0]);
      (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1);
      (**(code **)(lVar7 + 0x40))(0x8892,0);
    }
    else {
      (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1);
    }
  }
  for (local_a0 = 0; local_a0 < (this->m_spec).dynamicAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_dyn",&local_50);
    GVar5 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    location = GVar5;
    (**(code **)(lVar7 + 0x610))(GVar5);
    std::vector<int,_std::allocator<int>_>::push_back(&dynamicAttributeLocations,&location);
  }
  if ((((this->m_spec).useDrawElements != false) && ((this->m_spec).useIndexBuffer == true)) &&
     ((this->m_spec).dynamicIndices == false)) {
    (**(code **)(lVar7 + 0x40))(0x8893,this->m_batchedStaticIndexBuffer);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2d2);
  (**(code **)(lVar7 + 0x648))();
  local_58 = deGetMicroseconds();
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < (this->m_spec).dynamicAttributeCount; lVar10 = lVar10 + 1) {
    if ((this->m_spec).useDynamicBuffer == true) {
      (**(code **)(lVar7 + 0x40))
                (0x8892,(this->m_batchedDynamicBuffers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10]);
      (**(code **)(lVar7 + 0x19f0))
                (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10],4,0x1400,1,0,0);
      (**(code **)(lVar7 + 0x40))(0x8892);
    }
    else {
      (**(code **)(lVar7 + 0x19f0))
                (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10],4,0x1400,1,0,
                 *(undefined8 *)
                  ((long)&(((this->m_dynamicAttributeDatas).
                            super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar11));
    }
    lVar11 = lVar11 + 0x18;
  }
  if ((this->m_spec).useDrawElements == false) {
    (**(code **)(lVar7 + 0x538))
              (4,0,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3);
  }
  else {
    bVar1 = (this->m_spec).dynamicIndices;
    if ((this->m_spec).useIndexBuffer == true) {
      if (bVar1 == false) {
        (**(code **)(lVar7 + 0x568))
                  (4,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3,0x1401,0);
      }
      else {
        (**(code **)(lVar7 + 0x40))(0x8893,this->m_batchedDynamicIndexBuffer);
        (**(code **)(lVar7 + 0x568))
                  (4,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3,0x1401,0);
        (**(code **)(lVar7 + 0x40))(0x8893,0);
      }
    }
    else {
      pvVar8 = &this->m_staticIndexData;
      if (bVar1 != false) {
        pvVar8 = &this->m_dynamicIndexData;
      }
      (**(code **)(lVar7 + 0x568))
                (4,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3,0x1401,
                 (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start);
    }
  }
  (**(code **)(lVar7 + 0x648))();
  local_60 = deGetMicroseconds();
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Batched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x300);
  (**(code **)(lVar7 + 0x40))(0x8893,0);
  for (local_a0 = 0; local_a0 < (this->m_spec).staticAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_static",&local_50);
    uVar4 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(lVar7 + 0x518))(uVar4);
  }
  for (lVar10 = 0; lVar10 < (this->m_spec).dynamicAttributeCount; lVar10 = lVar10 + 1) {
    (**(code **)(lVar7 + 0x518))
              (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10]);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to reset state after batched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x30d);
  dVar9 = local_60 - local_58;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>);
  return dVar9;
}

Assistant:

deUint64 DrawCallBatchingTest::renderBatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int attribute = 0; attribute < m_spec.dynamicAttributeCount; attribute++)
	{
		if (m_spec.useDynamicBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedDynamicBuffers[attribute]);
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribute][0]));
	}

	if (m_spec.useDrawElements)
	{
		if (m_spec.useIndexBuffer)
		{
			if (m_spec.dynamicIndices)
			{
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedDynamicIndexBuffer);
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			}
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
		}
		else
		{
			if (m_spec.dynamicIndices)
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[0]));
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
		}
	}
	else
		gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount * m_spec.drawCallCount);

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Batched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after batched rendering");

	return endUs - beginUs;
}